

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

FunctionValue *
SelectBestFunction(FunctionValue *__return_storage_ptr__,ExpressionContext *ctx,SynBase *source,
                  ArrayView<FunctionValue> functions,IntrusiveList<TypeHandle> generics,
                  ArrayView<ArgumentData> arguments,SmallArray<unsigned_int,_32U> *ratings)

{
  TypeHandle **ppTVar1;
  ModuleData *pMVar2;
  FunctionData *pFVar3;
  ExprBase *pEVar4;
  TypeStruct *pTVar5;
  SynIdentifier *pSVar6;
  SynBase *pSVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  FunctionValue proto;
  bool bVar10;
  uint depth;
  uint uVar11;
  int iVar12;
  MatchData *pMVar13;
  undefined4 extraout_var;
  TypeFunction *pTVar14;
  TypeHandle *pTVar15;
  FunctionValue *pFVar16;
  uint *puVar17;
  int iVar18;
  uint uVar19;
  FunctionData *pFVar20;
  TypeUnsizedArray *pTVar21;
  TypeBase *pTVar22;
  TypeUnsizedArray *pTVar23;
  uint arg;
  ulong uVar24;
  ExprBase **ppEVar25;
  ExpressionContext *this;
  uint newSize;
  ExpressionContext *pEVar26;
  ulong uVar27;
  ulong uVar28;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<CallArgumentData> arguments_01;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<CallArgumentData> arguments_02;
  ArrayView<CallArgumentData> arguments_03;
  IntrusiveList<TypeHandle> generics_00;
  uint extraRating;
  IntrusiveList<MatchData> aliases;
  SmallArray<TypeFunction_*,_16U> instanceTypes;
  SmallArray<CallArgumentData,_16U> result;
  TypeUnsizedArray *local_270;
  uint local_258;
  uint local_244;
  FunctionData *local_240;
  ExprBase *local_238;
  FunctionValue *local_230;
  SynBase *local_228;
  FunctionValue *local_220;
  SynBase *local_218;
  FunctionData *local_210;
  ExprBase *local_208;
  SynBase *local_200;
  undefined1 local_1f8 [24];
  undefined1 local_1e0 [160];
  uint local_140;
  undefined4 uStack_13c;
  ModuleData *local_38;
  MatchData *node;
  
  pEVar26 = functions._8_8_;
  newSize = functions.count;
  local_228 = source;
  if (ratings->max <= newSize) {
    SmallArray<unsigned_int,_32U>::grow(ratings,newSize);
  }
  ratings->count = newSize;
  pMVar2 = (ModuleData *)ctx->allocator;
  local_1e0._0_8_ = local_1e0 + 0x10;
  local_1e0._8_8_ = (ModuleData **)0x1000000000;
  this = (ExpressionContext *)&stack0xfffffffffffffec8;
  local_1e0._144_8_ = pMVar2;
  memset((ExpressionContext *)&stack0xfffffffffffffec8,0,0x100);
  local_140 = 0;
  uStack_13c = 0x10;
  local_1e0._152_8_ = (ExpressionContext *)&stack0xfffffffffffffec8;
  local_38 = pMVar2;
  if (newSize == 0) {
    __return_storage_ptr__->function = (FunctionData *)0x0;
    __return_storage_ptr__->context = (ExprBase *)0x0;
  }
  else {
    local_238 = (ExprBase *)CONCAT44(local_238._4_4_,arguments.count);
    uVar27 = (ulong)newSize;
    uVar28 = 0;
    local_270 = (TypeUnsizedArray *)0x0;
    local_230 = functions.data;
    local_220 = __return_storage_ptr__;
    do {
      pFVar3 = local_230[uVar28].function;
      pEVar4 = local_230[uVar28].context;
      if (local_1e0._8_4_ == local_1e0._12_4_) {
        this = (ExpressionContext *)local_1e0;
        SmallArray<TypeFunction_*,_16U>::grow
                  ((SmallArray<TypeFunction_*,_16U> *)this,local_1e0._8_4_);
      }
      if ((TypeFunction **)local_1e0._0_8_ == (TypeFunction **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<TypeFunction *, 16>::push_back(const T &) [T = TypeFunction *, N = 16]"
                     );
      }
      uVar24 = local_1e0._8_8_ & 0xffffffff;
      local_1e0._8_4_ = local_1e0._8_4_ + 1;
      *(TypeFunction **)(local_1e0._0_8_ + uVar24 * 8) = pFVar3->type;
      pTVar22 = pEVar4->type;
      pTVar21 = local_270;
      if ((((pTVar22 != (TypeBase *)0x0) && (pTVar22->typeID == 0x12)) &&
          (pTVar23 = (TypeUnsizedArray *)pTVar22[1]._vptr_TypeBase,
          pTVar23 != (TypeUnsizedArray *)0x0)) &&
         ((((pTVar23->super_TypeStruct).super_TypeBase.typeID == 0x18 &&
           (*(char *)&pTVar23[1].super_TypeStruct.constants.tail == '\x01')) &&
          ((pTVar21 = pTVar23, local_270 != (TypeUnsizedArray *)0x0 &&
           (pTVar21 = local_270, local_270 != pTVar23)))))) {
        __assert_fail("preferredParent == typeClass",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x19f1,
                      "FunctionValue SelectBestFunction(ExpressionContext &, SynBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, SmallArray<unsigned int, 32> &)"
                     );
      }
      local_270 = pTVar21;
      if (generics.head == (TypeHandle *)0x0) {
LAB_001ee6ed:
        local_244 = 0;
        uVar8 = (pFVar3->arguments).data;
        uVar9 = (pFVar3->arguments).count;
        functionArguments.count = uVar9;
        functionArguments.data = (ArgumentData *)uVar8;
        arguments_00.count = local_238._0_4_;
        arguments_00.data = arguments.data;
        arguments_00._12_4_ = 0;
        functionArguments._12_4_ = 0;
        this = ctx;
        pEVar26 = (ExpressionContext *)arguments.data;
        bVar10 = PrepareArgumentsForFunctionCall
                           (ctx,local_228,functionArguments,arguments_00,
                            (SmallArray<CallArgumentData,_16U> *)(local_1e0 + 0x98),&local_244,false
                           );
        if (!bVar10) goto LAB_001ee8b8;
        arguments_02.count = local_140;
        arguments_02.data = (CallArgumentData *)local_1e0._152_8_;
        arguments_02._12_4_ = 0;
        pEVar26 = (ExpressionContext *)(ulong)local_140;
        this = ctx;
        uVar11 = GetFunctionRating(ctx,pFVar3,pFVar3->type,arguments_02);
        puVar17 = ratings->data;
        puVar17[uVar28] = uVar11;
        if (uVar11 != 0xffffffff) {
          puVar17[uVar28] = local_244 + uVar11;
          bVar10 = ExpressionContext::IsGenericFunction(this,pFVar3);
          if (bVar10) {
            pTVar5 = (TypeStruct *)pEVar4->type;
            pFVar20 = (FunctionData *)pFVar3->scope->ownerType;
            if (pTVar5 == ctx->typeAutoRef) {
              if (pFVar20 == (FunctionData *)0x0) {
                __assert_fail("function->scope->ownerType",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x1a2b,
                              "FunctionValue SelectBestFunction(ExpressionContext &, SynBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, SmallArray<unsigned int, 32> &)"
                             );
              }
            }
            else if (pFVar20 == (FunctionData *)0x0) {
              pFVar20 = (FunctionData *)0x0;
            }
            else {
              pFVar20 = (FunctionData *)pTVar5->typeScope;
            }
            local_1f8._0_8_ = (MatchData *)0x0;
            local_1f8._8_8_ = (MatchData *)0x0;
            pMVar13 = (pFVar3->generics).head;
            pTVar15 = generics.head;
            local_240 = pFVar20;
            if (pMVar13 != (MatchData *)0x0 && generics.head != (TypeHandle *)0x0) {
              do {
                iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                node = (MatchData *)CONCAT44(extraout_var,iVar12);
                pSVar6 = pMVar13->name;
                pTVar22 = pTVar15->type;
                node->name = pSVar6;
                node->type = pTVar22;
                node->next = (MatchData *)0x0;
                node->listed = false;
                if (pSVar6 == (SynIdentifier *)0x0) {
                  __assert_fail("name",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                                ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
                }
                IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)local_1f8,node);
                pMVar13 = pMVar13->next;
              } while ((pMVar13 != (MatchData *)0x0) &&
                      (ppTVar1 = &pTVar15->next, pTVar15 = *ppTVar1, *ppTVar1 != (TypeHandle *)0x0))
              ;
            }
            arguments_01.count = local_140;
            arguments_01.data = (CallArgumentData *)local_1e0._152_8_;
            arguments_01._12_4_ = 0;
            this = ctx;
            pEVar26 = (ExpressionContext *)local_1e0._152_8_;
            pTVar14 = GetGenericFunctionInstanceType
                                (ctx,local_228,(TypeBase *)local_240,pFVar3,arguments_01,
                                 (IntrusiveList<MatchData> *)local_1f8);
            if (local_1e0._8_4_ == 0) {
              __assert_fail("count > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x172,
                            "T &SmallArray<TypeFunction *, 16>::back() [T = TypeFunction *, N = 16]"
                           );
            }
            *(TypeFunction **)(local_1e0._0_8_ + (ulong)(local_1e0._8_4_ - 1) * 8) = pTVar14;
            if (pTVar14 == (TypeFunction *)0x0) goto LAB_001ee8b8;
            arguments_03.count = local_140;
            arguments_03.data = (CallArgumentData *)local_1e0._152_8_;
            arguments_03._12_4_ = 0;
            pEVar26 = (ExpressionContext *)(ulong)local_140;
            this = ctx;
            uVar11 = GetFunctionRating(ctx,pFVar3,pTVar14,arguments_03);
            ratings->data[uVar28] = uVar11;
          }
        }
      }
      else {
        pMVar13 = (pFVar3->generics).head;
        pTVar15 = generics.head;
        if (pMVar13 != (MatchData *)0x0) {
          do {
            if ((pMVar13->type->isGeneric == false) && (pMVar13->type != pTVar15->type))
            goto LAB_001ee8b8;
            pTVar15 = pTVar15->next;
            pMVar13 = pMVar13->next;
          } while ((pMVar13 != (MatchData *)0x0) && (pTVar15 != (TypeHandle *)0x0));
          if (pTVar15 == (TypeHandle *)0x0) goto LAB_001ee6ed;
        }
LAB_001ee8b8:
        ratings->data[uVar28] = 0xffffffff;
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != uVar27);
    if (local_270 != (TypeUnsizedArray *)0x0) {
      uVar28 = 0;
      do {
        pFVar3 = local_230[uVar28].function;
        uVar24 = 0;
        do {
          if (uVar28 != uVar24) {
            uVar11 = ratings->data[uVar24];
            if ((uVar11 != 0xffffffff) && (ratings->data[uVar28] == uVar11)) {
              if ((local_1e0._8_8_ & 0xffffffff) <= uVar28) {
LAB_001eed0a:
                __assert_fail("index < count",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                              ,0x199,
                              "T &SmallArray<TypeFunction *, 16>::operator[](unsigned int) [T = TypeFunction *, N = 16]"
                             );
              }
              iVar12 = 0;
              for (pTVar15 = ((*(TypeFunction **)(local_1e0._0_8_ + uVar28 * 8))->arguments).head;
                  pTVar15 != (TypeHandle *)0x0; pTVar15 = pTVar15->next) {
                iVar12 = iVar12 + 1;
              }
              if ((local_1e0._8_8_ & 0xffffffff) <= uVar24) goto LAB_001eed0a;
              iVar18 = 0;
              for (pTVar15 = ((*(TypeFunction **)(local_1e0._0_8_ + uVar24 * 8))->arguments).head;
                  pTVar15 != (TypeHandle *)0x0; pTVar15 = pTVar15->next) {
                iVar18 = iVar18 + 1;
              }
              if (iVar12 == iVar18) {
                pFVar20 = local_230[uVar24].function;
                bVar10 = true;
                uVar11 = 0;
                while( true ) {
                  this = *(ExpressionContext **)(local_1e0._0_8_ + uVar28 * 8);
                  pTVar14 = (TypeFunction *)(this->uniqueDependencies).little[7];
                  uVar19 = 0;
                  if (pTVar14 != (TypeFunction *)0x0) {
                    uVar19 = 0;
                    do {
                      uVar19 = uVar19 + 1;
                      pTVar14 = *(TypeFunction **)&(pTVar14->super_TypeBase).typeID;
                    } while (pTVar14 != (TypeFunction *)0x0);
                  }
                  if (uVar19 <= uVar11) break;
                  pTVar15 = IntrusiveList<TypeHandle>::operator[]
                                      ((IntrusiveList<TypeHandle> *)
                                       ((this->uniqueDependencies).little + 7),uVar11);
                  if ((local_1e0._8_8_ & 0xffffffff) <= uVar24) goto LAB_001eed0a;
                  pTVar22 = pTVar15->type;
                  pTVar15 = IntrusiveList<TypeHandle>::operator[]
                                      (&(*(TypeFunction **)(local_1e0._0_8_ + uVar24 * 8))->
                                        arguments,uVar11);
                  bVar10 = (bool)(bVar10 & pTVar22 == pTVar15->type);
                  uVar11 = uVar11 + 1;
                  if ((local_1e0._8_8_ & 0xffffffff) <= uVar28) goto LAB_001eed0a;
                }
                if (bVar10) {
                  pTVar21 = (TypeUnsizedArray *)pFVar3->scope->ownerType;
                  if ((pTVar21 == (TypeUnsizedArray *)0x0) ||
                     ((pTVar21->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
                    pTVar21 = (TypeUnsizedArray *)0x0;
                  }
                  uVar11 = 0;
                  pTVar23 = local_270;
                  do {
                    if (pTVar23 == pTVar21) goto LAB_001eea55;
                    uVar11 = uVar11 + 1;
                    pTVar23 = (TypeUnsizedArray *)pTVar23[1].subType;
                  } while (pTVar23 != (TypeUnsizedArray *)0x0);
                  uVar11 = 0xffffffff;
LAB_001eea55:
                  pTVar22 = pFVar20->scope->ownerType;
                  if ((pTVar22 == (TypeBase *)0x0) || (pTVar22->typeID != 0x18)) {
                    pTVar22 = (TypeBase *)0x0;
                  }
                  uVar19 = 0;
                  pTVar21 = local_270;
                  do {
                    if (pTVar21 == (TypeUnsizedArray *)pTVar22) goto LAB_001eea89;
                    uVar19 = uVar19 + 1;
                    pTVar21 = *(TypeUnsizedArray **)
                               &((TypeStruct *)&pTVar21[1].subType)->super_TypeBase;
                  } while (pTVar21 != (TypeUnsizedArray *)0x0);
                  uVar19 = 0xffffffff;
LAB_001eea89:
                  if (uVar11 < uVar19) {
                    ratings->data[uVar24] = 0xffffffff;
                  }
                }
              }
            }
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar27);
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar27);
    }
    local_220->source = (SynBase *)0x0;
    local_220->function = (FunctionData *)0x0;
    local_220->context = (ExprBase *)0x0;
    __return_storage_ptr__ = local_220;
    if (newSize != 0) {
      puVar17 = ratings->data;
      ppEVar25 = &local_230->context;
      local_258 = 0xffffffff;
      uVar28 = 0;
      local_238 = (ExprBase *)0x0;
      local_240 = (FunctionData *)0x0;
      local_270._0_4_ = 0xffffffff;
      local_208 = (ExprBase *)0x0;
      local_210 = (FunctionData *)0x0;
      local_218 = (SynBase *)0x0;
      local_200 = (SynBase *)0x0;
      do {
        pSVar7 = ((FunctionValue *)(ppEVar25 + -2))->source;
        pFVar3 = (FunctionData *)ppEVar25[-1];
        pEVar4 = *ppEVar25;
        bVar10 = ExpressionContext::IsGenericFunction(this,pFVar3);
        __return_storage_ptr__ = local_220;
        uVar11 = puVar17[uVar28];
        if (bVar10) {
          if (uVar11 < local_258) {
            local_218 = pSVar7;
            local_210 = pFVar3;
            local_208 = pEVar4;
            local_258 = uVar11;
          }
        }
        else if (uVar11 < (uint)local_270) {
          local_240 = pFVar3;
          local_238 = pEVar4;
          local_200 = pSVar7;
          local_270._0_4_ = uVar11;
        }
        uVar28 = uVar28 + 1;
        ppEVar25 = ppEVar25 + 3;
      } while (uVar27 != uVar28);
      local_220->function = local_240;
      local_220->context = local_238;
      local_220->source = local_200;
      if (local_258 < (uint)local_270) {
        local_220->source = local_218;
        local_220->function = local_210;
        local_220->context = local_208;
      }
      else if (newSize != 0) {
        uVar28 = 0;
        pFVar16 = local_230;
        do {
          pFVar3 = pFVar16->function;
          bVar10 = ExpressionContext::IsGenericFunction(this,pFVar3);
          if (bVar10) {
            puVar17 = ratings->data;
            if (((((uint)local_270 != 0xffffffff) && (puVar17[uVar28] == (uint)local_270)) &&
                ((TypeStruct *)pFVar16->context->type == ctx->typeAutoRef)) &&
               (pFVar3->scope->ownerType->isGeneric == false)) {
              this = (ExpressionContext *)local_1f8;
              proto.context._4_4_ = (int)((ulong)pFVar16->context >> 0x20);
              proto._0_20_ = *(undefined1 (*) [20])pFVar16;
              generics_00.tail = (TypeHandle *)pEVar26;
              generics_00.head = generics.head;
              CreateGenericFunctionInstance
                        ((FunctionValue *)this,ctx,local_228,proto,generics_00,arguments,true);
              puVar17 = ratings->data;
            }
            puVar17[uVar28] = 0xffffffff;
          }
          uVar28 = uVar28 + 1;
          pFVar16 = pFVar16 + 1;
        } while (uVar27 != uVar28);
      }
      goto LAB_001eec0a;
    }
  }
  __return_storage_ptr__->source = (SynBase *)0x0;
LAB_001eec0a:
  SmallArray<CallArgumentData,_16U>::~SmallArray
            ((SmallArray<CallArgumentData,_16U> *)(local_1e0 + 0x98));
  SmallArray<TypeFunction_*,_16U>::~SmallArray((SmallArray<TypeFunction_*,_16U> *)local_1e0);
  return __return_storage_ptr__;
}

Assistant:

FunctionValue SelectBestFunction(ExpressionContext &ctx, SynBase *source, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, SmallArray<unsigned, 32> &ratings)
{
	ratings.resize(functions.count);

	SmallArray<TypeFunction*, 16> instanceTypes(ctx.allocator);

	SmallArray<CallArgumentData, 16> result(ctx.allocator);

	TypeClass *preferredParent = NULL;

	for(unsigned i = 0; i < functions.count; i++)
	{
		FunctionValue value = functions.data[i];

		FunctionData *function = value.function;

		instanceTypes.push_back(function->type);

		if(TypeRef *typeRef = getType<TypeRef>(value.context->type))
		{
			if(TypeClass *typeClass = getType<TypeClass>(typeRef->subType))
			{
				if(typeClass->extendable)
				{
					if(!preferredParent)
						preferredParent = typeClass;
					else
						assert(preferredParent == typeClass);
				}
			}
		}

		if(!generics.empty())
		{
			MatchData *ca = function->generics.head;
			TypeHandle *cb = generics.head;

			bool sameGenerics = true;

			for(; ca && cb; ca = ca->next, cb = cb->next)
			{
				if(!ca->type->isGeneric && ca->type != cb->type)
				{
					sameGenerics = false;
					break;
				}
			}

			// Fail if provided explicit type list elements can't match
			if(!sameGenerics)
			{
				ratings.data[i] = ~0u;
				continue;
			}

			// Fail if provided explicit type list is larger than expected explicit type list
			if(cb)
			{
				ratings.data[i] = ~0u;
				continue;
			}
		}

		unsigned extraRating = 0;

		// Handle named argument order, default argument values and variadic functions
		if(!PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, &extraRating, false))
		{
			ratings.data[i] = ~0u;
			continue;
		}

		ratings.data[i] = GetFunctionRating(ctx, function, function->type, result);

		if(ratings.data[i] == ~0u)
			continue;

		ratings.data[i] += extraRating;

		if(ctx.IsGenericFunction(function))
		{
			TypeBase *parentType = NULL;

			if(value.context->type == ctx.typeAutoRef)
			{
				assert(function->scope->ownerType);
				parentType = function->scope->ownerType;
			}
			else if(function->scope->ownerType)
			{
				parentType = getType<TypeRef>(value.context->type)->subType;
			}

			IntrusiveList<MatchData> aliases;

			{
				MatchData *currMatch = function->generics.head;
				TypeHandle *currGeneric = generics.head;

				for(; currMatch && currGeneric; currMatch = currMatch->next, currGeneric = currGeneric->next)
					aliases.push_back(new (ctx.get<MatchData>()) MatchData(currMatch->name, currGeneric->type));
			}

			TypeFunction *instance = GetGenericFunctionInstanceType(ctx, source, parentType, function, result, aliases);

			instanceTypes.back() = instance;

			if(!instance)
			{
				ratings.data[i] = ~0u;
				continue;
			}
			
			ratings.data[i] = GetFunctionRating(ctx, function, instance, result);

			if(ratings.data[i] == ~0u)
				continue;
		}
	}

	// For member functions, if there are multiple functions with the same rating and arguments, hide those which parent is derived further from preferred parent
	if(preferredParent)
	{
		for(unsigned i = 0; i < functions.count; i++)
		{
			FunctionData *a = functions.data[i].function;

			for(unsigned k = 0; k < functions.size(); k++)
			{
				if(i == k)
					continue;

				if(ratings.data[k] == ~0u)
					continue;

				FunctionData *b = functions.data[k].function;

				if(ratings.data[i] == ratings.data[k] && instanceTypes[i]->arguments.size() == instanceTypes[k]->arguments.size())
				{
					bool sameArguments = true;

					for(unsigned arg = 0; arg < instanceTypes[i]->arguments.size(); arg++)
					{
						if(instanceTypes[i]->arguments[arg]->type != instanceTypes[k]->arguments[arg]->type)
							sameArguments = false;
					}

					if(sameArguments)
					{
						unsigned aDepth = GetDerivedFromDepth(preferredParent, getType<TypeClass>(a->scope->ownerType));
						unsigned bDepth = GetDerivedFromDepth(preferredParent, getType<TypeClass>(b->scope->ownerType));

						if (aDepth < bDepth)
							ratings.data[k] = ~0u;
					}
				}
			}
		}
	}

	// Select best generic and non-generic function
	unsigned bestRating = ~0u;
	FunctionValue bestFunction;

	unsigned bestGenericRating = ~0u;
	FunctionValue bestGenericFunction;

	for(unsigned i = 0; i < functions.count; i++)
	{
		FunctionValue value = functions.data[i];

		FunctionData *function = value.function;

		if(ctx.IsGenericFunction(function))
		{
			if(ratings.data[i] < bestGenericRating)
			{
				bestGenericRating = ratings.data[i];
				bestGenericFunction = value;
			}
		}
		else
		{
			if(ratings.data[i] < bestRating)
			{
				bestRating = ratings.data[i];
				bestFunction = value;
			}
		}
	}

	// Use generic function only if it is better that selected
	if(bestGenericRating < bestRating)
	{
		bestRating = bestGenericRating;
		bestFunction = bestGenericFunction;
	}
	else
	{
		// Hide all generic functions from selection
		for(unsigned i = 0; i < functions.count; i++)
		{
			FunctionData *function = functions.data[i].function;

			if(ctx.IsGenericFunction(function))
			{
				if(bestRating != ~0u && ratings.data[i] == bestRating && functions.data[i].context->type == ctx.typeAutoRef && !function->scope->ownerType->isGeneric)
					CreateGenericFunctionInstance(ctx, source, functions.data[i], generics, arguments, true);

				ratings.data[i] = ~0u;
			}
		}
	}

	return bestFunction;
}